

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O2

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ResetCurMatrix::operator()
          (ResetCurMatrix *this,iterator_t *str,iterator_t *end)

{
  if (this->_m_po->_m_matrixModified != true) {
    return;
  }
  ClearCurMatrix(this->_m_po);
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(DEBUG_POMDP_PARSE)
                    std::cout << "ResetCurMatrix() called... ";
                if(_m_po->_m_matrixModified)
                {
                    if(DEBUG_POMDP_PARSE)
                        std::cout << "resetting current matrix..." ;
                    
                    _m_po->ClearCurMatrix();
                }
                if(DEBUG_POMDP_PARSE)
                    std::cout << std::endl;
            }